

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_result.hpp
# Opt level: O3

ArrowQueryResult * __thiscall duckdb::QueryResult::Cast<duckdb::ArrowQueryResult>(QueryResult *this)

{
  InternalException *this_00;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if (this[8] == (QueryResult)0x3) {
    return (ArrowQueryResult *)this;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"Failed to cast query result to type - query result type mismatch",
             "");
  duckdb::InternalException::InternalException(this_00,(string *)local_40);
  __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

TARGET &Cast() {
		if (type != TARGET::TYPE) {
			throw InternalException("Failed to cast query result to type - query result type mismatch");
		}
		return reinterpret_cast<TARGET &>(*this);
	}